

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O2

Am_Wrapper * pass_window_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  Am_Object owner;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,&Am_Graphical_Object);
    bVar1 = Am_Object::Is_Instance_Of(&owner,&local_18);
    if (bVar1) {
      Am_Object::~Am_Object(&local_18);
    }
    else {
      Am_Object::Am_Object(&local_10,&Am_Window);
      bVar1 = Am_Object::Is_Instance_Of(&owner,&local_10);
      Am_Object::~Am_Object(&local_10);
      Am_Object::~Am_Object(&local_18);
      if (!bVar1) goto LAB_001e0530;
    }
    this = Am_Object::Get(&owner,0x68,0);
    pAVar2 = Am_Value::operator_cast_to_Am_Wrapper_(this);
  }
  else {
LAB_001e0530:
    pAVar2 = (Am_Wrapper *)0x0;
  }
  Am_Object::~Am_Object(&owner);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(pass_window)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && (owner.Is_Instance_Of(Am_Graphical_Object) ||
                        owner.Is_Instance_Of(Am_Window)))
    return owner.Get(Am_WINDOW);
  else
    return nullptr;
}